

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apx_connection.c
# Opt level: O2

apx_error_t apx_connection_create(apx_connection_t *self)

{
  apx_client_t *paVar1;
  apx_error_t aVar2;
  
  if (self == (apx_connection_t *)0x0) {
    aVar2 = 1;
  }
  else {
    paVar1 = (apx_client_t *)apx_client_new();
    self->client = paVar1;
    if (paVar1 == (apx_client_t *)0x0) {
      aVar2 = 2;
    }
    else {
      apx_client_register_event_listener(paVar1);
      aVar2 = 0;
      adt_hash_create(&self->provide_port_lookup_table);
      pthread_mutex_init((pthread_mutex_t *)&self->mutex,(pthread_mutexattr_t *)0x0);
    }
  }
  return aVar2;
}

Assistant:

apx_error_t apx_connection_create(apx_connection_t *self)
{
   if (self != 0)
   {
      apx_clientEventListener_t listener;
      self->client = apx_client_new();
      if (self->client == NULL)
      {
         return APX_MEM_ERROR;
      }
      memset(&listener, 0, sizeof(listener));
      listener.arg = (void*) self;
      listener.client_connect1 = apx_connection_on_connect;
      listener.client_disconnect1 = apx_connection_on_disconnect;
      listener.require_port_write1 = apx_connection_on_require_port_write;
      apx_client_register_event_listener(self->client, &listener);
      adt_hash_create(&self->provide_port_lookup_table, NULL);
      MUTEX_INIT(self->mutex);
      return APX_NO_ERROR;
   }
   return APX_INVALID_ARGUMENT_ERROR;
}